

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImTriangleClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p)

{
  float rhs;
  float fVar1;
  ImVec2 IStack_6c;
  float m;
  float local_64;
  ImVec2 IStack_60;
  float dist2_ca;
  float local_58;
  ImVec2 IStack_54;
  float dist2_bc;
  float local_4c;
  ImVec2 IStack_48;
  float dist2_ab;
  ImVec2 proj_ca;
  ImVec2 proj_bc;
  ImVec2 proj_ab;
  ImVec2 *p_local;
  ImVec2 *c_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  
  proj_bc = ImLineClosestPoint(a,b,p);
  proj_ca = ImLineClosestPoint(b,c,p);
  IStack_48 = ImLineClosestPoint(c,a,p);
  IStack_54 = operator-(p,&proj_bc);
  local_4c = ImLengthSqr(&stack0xffffffffffffffac);
  IStack_60 = operator-(p,&proj_ca);
  local_58 = ImLengthSqr(&stack0xffffffffffffffa0);
  IStack_6c = operator-(p,&stack0xffffffffffffffb8);
  local_64 = ImLengthSqr(&stack0xffffffffffffff94);
  fVar1 = local_4c;
  rhs = ImMin<float>(local_58,local_64);
  fVar1 = ImMin<float>(fVar1,rhs);
  if ((fVar1 != local_4c) || (NAN(fVar1) || NAN(local_4c))) {
    if ((fVar1 != local_58) || (NAN(fVar1) || NAN(local_58))) {
      a_local = (ImVec2 *)IStack_48;
    }
    else {
      a_local = (ImVec2 *)proj_ca;
    }
  }
  else {
    a_local = (ImVec2 *)proj_bc;
  }
  return (ImVec2)a_local;
}

Assistant:

ImVec2 ImTriangleClosestPoint(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p)
{
    ImVec2 proj_ab = ImLineClosestPoint(a, b, p);
    ImVec2 proj_bc = ImLineClosestPoint(b, c, p);
    ImVec2 proj_ca = ImLineClosestPoint(c, a, p);
    float dist2_ab = ImLengthSqr(p - proj_ab);
    float dist2_bc = ImLengthSqr(p - proj_bc);
    float dist2_ca = ImLengthSqr(p - proj_ca);
    float m = ImMin(dist2_ab, ImMin(dist2_bc, dist2_ca));
    if (m == dist2_ab)
        return proj_ab;
    if (m == dist2_bc)
        return proj_bc;
    return proj_ca;
}